

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  Exception *this_00;
  pointer pTVar3;
  long lVar4;
  size_t ab;
  ulong uVar5;
  undefined1 in_XMM2 [16];
  allocator<char> local_41;
  string local_40;
  
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar2 != '\0') {
    for (pTVar3 = (this->_Qa).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != (this->_Qa).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,(long)(pTVar3->_p)._p.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pTVar3->_p)._p.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 3);
      TProb<double>::fill(&pTVar3->_p,1.0 / auVar1._0_8_);
    }
    for (pTVar3 = (this->_Qb).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != (this->_Qb).
                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,(long)(pTVar3->_p)._p.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pTVar3->_p)._p.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 3);
      TProb<double>::fill(&pTVar3->_p,1.0 / auVar1._0_8_);
    }
    lVar4 = 0x20;
    uVar5 = 0;
    while( true ) {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x118) -
                  *(long *)(CONCAT44(extraout_var,iVar2) + 0x110) >> 4) <= uVar5) break;
      pTVar3 = (this->_muab).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,*(long *)((long)&(pTVar3->_vs)._vars.
                                                                                                                      
                                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + lVar4
                                                  ) -
                                          *(long *)((long)&(pTVar3->_vs)._vars.
                                                                                                                      
                                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar4)
                                          >> 3);
      TProb<double>::fill((TProb<double> *)
                          ((long)&(pTVar3->_vs)._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4),
                          1.0 / auVar1._0_8_);
      pTVar3 = (this->_muba).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,*(long *)((long)&(pTVar3->_vs)._vars.
                                                                                                                      
                                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + lVar4
                                                  ) -
                                          *(long *)((long)&(pTVar3->_vs)._vars.
                                                                                                                      
                                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar4)
                                          >> 3);
      TProb<double>::fill((TProb<double> *)
                          ((long)&(pTVar3->_vs)._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4),
                          1.0 / auVar1._0_8_);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
    }
    return iVar2;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"hak.cpp, line 187",&local_41);
  Exception::Exception(this_00,8,&local_40);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HAK::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            alpha->fill( 1.0 / alpha->stateSpace() );

        for( vector<Factor>::iterator beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            beta->fill( 1.0 / beta->stateSpace() );

        for( size_t ab = 0; ab < grm().nr_Redges(); ab++ ) {
            _muab[ab].fill( 1.0 / _muab[ab].stateSpace() );
            _muba[ab].fill( 1.0 / _muba[ab].stateSpace() );
        }
    }